

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser.cpp
# Opt level: O1

void __thiscall
CLaser::CLaser(CLaser *this,CGameWorld *pGameWorld,vec2 Pos,vec2 Direction,float StartEnergy,
              int Owner)

{
  CEntity::CEntity(&this->super_CEntity,pGameWorld,1,Pos,0);
  (this->super_CEntity)._vptr_CEntity = (_func_int **)&PTR__CEntity_00163f10;
  this->m_Owner = Owner;
  this->m_Energy = StartEnergy;
  this->m_Dir = Direction;
  this->m_Bounces = 0;
  this->m_EvalTick = 0;
  CGameWorld::InsertEntity((this->super_CEntity).m_pGameWorld,&this->super_CEntity);
  DoBounce(this);
  return;
}

Assistant:

CLaser::CLaser(CGameWorld *pGameWorld, vec2 Pos, vec2 Direction, float StartEnergy, int Owner)
: CEntity(pGameWorld, CGameWorld::ENTTYPE_LASER, Pos)
{
	m_Owner = Owner;
	m_Energy = StartEnergy;
	m_Dir = Direction;
	m_Bounces = 0;
	m_EvalTick = 0;
	GameWorld()->InsertEntity(this);
	DoBounce();
}